

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenElementSegmentRef
BinaryenAddPassiveElementSegment
          (BinaryenModuleRef module,char *name,char **funcNames,BinaryenIndex numFuncNames)

{
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var1;
  Function *pFVar2;
  ElementSegment *pEVar3;
  Fatal *this;
  ulong uVar4;
  bool bVar5;
  undefined1 local_1f8 [392];
  Name local_70;
  string_view local_60;
  string_view local_50;
  Builder local_40;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_38;
  __single_object segment;
  
  std::make_unique<wasm::ElementSegment>();
  _Var1._M_head_impl = local_38._M_head_impl;
  wasm::Name::Name(&local_70,name);
  ((_Var1._M_head_impl)->super_Named).name.super_IString.str._M_len =
       local_70.super_IString.str._M_len;
  ((_Var1._M_head_impl)->super_Named).name.super_IString.str._M_str =
       local_70.super_IString.str._M_str;
  ((_Var1._M_head_impl)->super_Named).hasExplicitName = true;
  uVar4 = (ulong)numFuncNames;
  while( true ) {
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) {
      pEVar3 = wasm::Module::addElementSegment
                         (module,(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                  *)&local_38);
      std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
                ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                 &local_38);
      return pEVar3;
    }
    wasm::Name::Name((Name *)&local_60,*funcNames);
    pFVar2 = wasm::Module::getFunctionOrNull(module,(Name)local_60);
    _Var1._M_head_impl = local_38._M_head_impl;
    if (pFVar2 == (Function *)0x0) break;
    local_40.wasm = module;
    wasm::Name::Name((Name *)&local_50,*funcNames);
    local_1f8._0_8_ =
         wasm::Builder::makeRefFunc(&local_40,(Name)local_50,(HeapType)(pFVar2->type).id);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
               &(_Var1._M_head_impl)->data,(Expression **)local_1f8);
    funcNames = funcNames + 1;
  }
  wasm::Fatal::Fatal((Fatal *)local_1f8);
  std::operator<<((ostream *)(local_1f8 + 0x10),"invalid function \'");
  this = wasm::Fatal::operator<<((Fatal *)local_1f8,funcNames);
  wasm::Fatal::operator<<(this,(char (*) [3])"\'.");
  wasm::Fatal::~Fatal((Fatal *)local_1f8);
}

Assistant:

BinaryenElementSegmentRef
BinaryenAddPassiveElementSegment(BinaryenModuleRef module,
                                 const char* name,
                                 const char** funcNames,
                                 BinaryenIndex numFuncNames) {
  auto segment = std::make_unique<ElementSegment>();
  segment->setExplicitName(name);
  for (BinaryenIndex i = 0; i < numFuncNames; i++) {
    auto* func = ((Module*)module)->getFunctionOrNull(funcNames[i]);
    if (func == nullptr) {
      Fatal() << "invalid function '" << funcNames[i] << "'.";
    }
    segment->data.push_back(
      Builder(*(Module*)module).makeRefFunc(funcNames[i], func->type));
  }
  return ((Module*)module)->addElementSegment(std::move(segment));
}